

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O2

bool IsBlockTerminator(RegVmLoweredInstruction *lowInstruction)

{
  return (bool)((byte)(0x4e0000000 >> ((byte)lowInstruction->code & 0x3f)) &
               lowInstruction->code < rviAddImm);
}

Assistant:

bool IsBlockTerminator(RegVmLoweredInstruction *lowInstruction)
{
	switch(lowInstruction->code)
	{
	case rviJmp:
	case rviJmpz:
	case rviJmpnz:
	case rviReturn:
		return true;
	default:
		break;
	}

	return false;
}